

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O1

int Amap_LibParseEquations(Amap_Lib_t *p,int fVerbose)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *vTruth;
  int *piVar5;
  Vec_Ptr_t *vVarNames;
  void **ppvVar6;
  Hop_Man_t *p_00;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  Hop_Obj_t *pRoot;
  uint *pTruth;
  char *pcVar9;
  uint uVar10;
  undefined8 *puVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  iVar4 = Amap_LibNumPinsMax(p);
  if (0xf < iVar4) {
    printf("Gates with more than %d inputs will be ignored.\n",0xf);
  }
  vTruth = (Vec_Int_t *)malloc(0x10);
  vTruth->nCap = 0x10000;
  vTruth->nSize = 0;
  piVar5 = (int *)malloc(0x40000);
  vTruth->pArray = piVar5;
  vVarNames = (Vec_Ptr_t *)malloc(0x10);
  vVarNames->nCap = 100;
  vVarNames->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vVarNames->pArray = ppvVar6;
  iVar12 = 0;
  p_00 = Hop_ManStart();
  Hop_IthVar(p_00,iVar4 + -1);
  pVVar7 = p->vGates;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar14];
      if (*(uint *)((long)pvVar1 + 0x38) < 0x1000000) {
        pcVar8 = Aig_MmFlexEntryFetch(p->pMemGates,4);
        *(char **)((long)pvVar1 + 0x30) = pcVar8;
        pcVar9 = *(char **)((long)pvVar1 + 0x28);
        iVar4 = strcmp(pcVar9,"CONST0");
        if (iVar4 == 0) {
          pcVar8[0] = '\0';
          pcVar8[1] = '\0';
          pcVar8[2] = '\0';
          pcVar8[3] = '\0';
        }
        else {
          iVar4 = strcmp(pcVar9,"CONST1");
          if (iVar4 != 0) {
            printf("Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n",pcVar9,
                   *(undefined8 *)((long)pvVar1 + 0x10));
            break;
          }
          pcVar8[0] = -1;
          pcVar8[1] = -1;
          pcVar8[2] = -1;
          pcVar8[3] = -1;
        }
      }
      else if (*(uint *)((long)pvVar1 + 0x38) < 0x10000000) {
        vVarNames->nSize = 0;
        if (0xffffff < *(uint *)((long)pvVar1 + 0x38)) {
          lVar13 = (long)vVarNames->nSize;
          uVar10 = vVarNames->nCap;
          ppvVar6 = vVarNames->pArray;
          puVar11 = (undefined8 *)((long)pvVar1 + 0x40);
          do {
            pvVar2 = (void *)*puVar11;
            if ((uint)lVar13 == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,0x80);
                }
                uVar10 = 0x10;
              }
              else {
                uVar3 = uVar10 * 2;
                if (SBORROW4(uVar10,uVar3) != 0 < (int)uVar10) {
                  uVar10 = uVar3;
                  if (ppvVar6 == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar3 << 3);
                  }
                  else {
                    ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar3 << 3);
                  }
                }
              }
            }
            ppvVar6[lVar13] = pvVar2;
            lVar13 = lVar13 + 1;
            puVar11 = puVar11 + 9;
          } while (puVar11 < (undefined8 *)((long)pvVar1 + 0x40) +
                             (ulong)*(byte *)((long)pvVar1 + 0x3b) * 9);
          vVarNames->nSize = (int)lVar13;
          vVarNames->nCap = uVar10;
          vVarNames->pArray = ppvVar6;
        }
        pRoot = Amap_ParseFormula(_stdout,*(char **)((long)pvVar1 + 0x28),vVarNames,p_00,
                                  *(char **)((long)pvVar1 + 0x10));
        if (pRoot == (Hop_Obj_t *)0x0) break;
        pTruth = Hop_ManConvertAigToTruth(p_00,pRoot,(uint)*(byte *)((long)pvVar1 + 0x3b),vTruth,0);
        iVar4 = Kit_TruthSupportSize(pTruth,(uint)*(byte *)((long)pvVar1 + 0x3b));
        uVar10 = *(uint *)((long)pvVar1 + 0x38);
        if (iVar4 < (int)(uVar10 >> 0x18)) {
          if (fVerbose != 0) {
            printf("Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n"
                   ,*(undefined8 *)((long)pvVar1 + 0x10),*(undefined8 *)((long)pvVar1 + 0x28));
          }
        }
        else {
          iVar4 = 4 << ((char)(uVar10 >> 0x18) - 5U & 0x1f);
          if (uVar10 < 0x6000000) {
            iVar4 = 4;
          }
          pcVar9 = Aig_MmFlexEntryFetch(p->pMemGates,iVar4);
          *(char **)((long)pvVar1 + 0x30) = pcVar9;
          iVar4 = 1 << ((char)(*(uint *)((long)pvVar1 + 0x38) >> 0x18) - 5U & 0x1f);
          if (*(uint *)((long)pvVar1 + 0x38) < 0x6000000) {
            iVar4 = 1;
          }
          memcpy(pcVar9,pTruth,(long)iVar4 << 2);
        }
      }
      lVar14 = lVar14 + 1;
      pVVar7 = p->vGates;
    } while (lVar14 < pVVar7->nSize);
    iVar12 = (int)lVar14;
  }
  if (vVarNames->pArray != (void **)0x0) {
    free(vVarNames->pArray);
    vVarNames->pArray = (void **)0x0;
  }
  free(vVarNames);
  if (vTruth->pArray != (int *)0x0) {
    free(vTruth->pArray);
    vTruth->pArray = (int *)0x0;
  }
  free(vTruth);
  Hop_ManStop(p_00);
  return (int)(iVar12 == p->vGates->nSize);
}

Assistant:

int Amap_LibParseEquations( Amap_Lib_t * p, int fVerbose )
{
//    extern int Kit_TruthSupportSize( unsigned * pTruth, int nVars );
    Hop_Man_t * pMan;
    Hop_Obj_t * pObj;
    Vec_Ptr_t * vNames;
    Vec_Int_t * vTruth;
    Amap_Gat_t * pGate;
    Amap_Pin_t * pPin;
    unsigned * pTruth;
    int i, nPinMax;
    nPinMax = Amap_LibNumPinsMax(p);
    if ( nPinMax > AMAP_MAXINS )
        printf( "Gates with more than %d inputs will be ignored.\n", AMAP_MAXINS );
    vTruth = Vec_IntAlloc( 1 << 16 );
    vNames = Vec_PtrAlloc( 100 );
    pMan = Hop_ManStart();
    Hop_IthVar( pMan, nPinMax - 1 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vGates, pGate, i )
    {
        if ( pGate->nPins == 0 )
        {
            pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, 4 );
            if ( strcmp( pGate->pForm, AMAP_STRING_CONST0 ) == 0 )
                pGate->pFunc[0] = 0;
            else if ( strcmp( pGate->pForm, AMAP_STRING_CONST1 ) == 0 )
                pGate->pFunc[0] = ~0;
            else
            {
                printf( "Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n", pGate->pForm, pGate->pName );
                break;
            }
            continue;
        }
        if ( pGate->nPins > AMAP_MAXINS )
            continue;
        Vec_PtrClear( vNames );
        Amap_GateForEachPin( pGate, pPin )
            Vec_PtrPush( vNames, pPin->pName );
        pObj = Amap_ParseFormula( stdout, pGate->pForm, vNames, pMan, pGate->pName );
        if ( pObj == NULL )
            break;
        pTruth = Hop_ManConvertAigToTruth( pMan, pObj, pGate->nPins, vTruth, 0 );
        if ( Kit_TruthSupportSize(pTruth, pGate->nPins) < (int)pGate->nPins )
        {
            if ( fVerbose )
                printf( "Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n", pGate->pName, pGate->pForm );
            continue;
        }
        pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
        memcpy( pGate->pFunc, pTruth, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
    }
    Vec_PtrFree( vNames );
    Vec_IntFree( vTruth );
    Hop_ManStop( pMan );
    return i == Vec_PtrSize(p->vGates);
}